

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::RenderingInfoWrapper::SetColorAttachmentClearValue
          (RenderingInfoWrapper *this,uint32_t Index,VkClearColorValue *ClearValue)

{
  undefined8 uVar1;
  Char *Message;
  type pVVar2;
  undefined1 local_40 [8];
  string msg;
  VkClearColorValue *ClearValue_local;
  uint32_t Index_local;
  RenderingInfoWrapper *this_local;
  
  msg.field_2._8_8_ = ClearValue;
  if ((this->m_RI).colorAttachmentCount <= Index) {
    Diligent::FormatString<char[26],char[34]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_RI.colorAttachmentCount",(char (*) [34])this);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"SetColorAttachmentClearValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x69);
    std::__cxx11::string::~string((string *)local_40);
  }
  uVar1 = msg.field_2._8_8_;
  pVVar2 = std::
           unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
           ::operator[](&this->m_Attachments,(ulong)Index);
  (pVVar2->clearValue).depthStencil = *(VkClearDepthStencilValue *)uVar1;
  *(undefined8 *)((long)&pVVar2->clearValue + 8) = *(undefined8 *)(uVar1 + 8);
  pVVar2 = std::
           unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
           ::operator[](&this->m_Attachments,(ulong)Index);
  pVVar2->loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  this->m_AttachmentClearMask = 1 << ((byte)Index & 0x1f) | this->m_AttachmentClearMask;
  return;
}

Assistant:

void SetColorAttachmentClearValue(uint32_t Index, const VkClearColorValue& ClearValue)
    {
        VERIFY_EXPR(Index < m_RI.colorAttachmentCount);
        m_Attachments[Index].clearValue.color = ClearValue;
        m_Attachments[Index].loadOp           = VK_ATTACHMENT_LOAD_OP_CLEAR;
        m_AttachmentClearMask |= 1u << Index;
    }